

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::resolve_pipeline_library_info
          (ThreadedReplayer *this,VkPipelineLibraryCreateInfoKHR *library,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  VkPipeline *ppVVar1;
  bool bVar2;
  pointer pvVar3;
  VkPipeline_T *local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_48;
  VkPipeline local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_38;
  const_iterator base_itr;
  uint32_t i;
  VkPipeline *libs;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *pipelines_local;
  VkPipelineLibraryCreateInfoKHR *library_local;
  ThreadedReplayer *this_local;
  
  ppVVar1 = library->pLibraries;
  for (base_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
       _M_cur._4_4_ = 0;
      base_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
      _M_cur._4_4_ < library->libraryCount;
      base_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
      _M_cur._4_4_ = base_itr.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                     ._M_cur._4_4_ + 1) {
    local_40 = ppVVar1[base_itr.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                       ._M_cur._4_4_];
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
         ::find(pipelines,(key_type *)&local_40);
    local_48._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>>
                   (pipelines);
    bVar2 = std::__detail::operator!=(&local_38,&local_48);
    if (bVar2) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>
                           *)&local_38);
      local_50 = pvVar3->second;
    }
    else {
      local_50 = (VkPipeline_T *)0x0;
    }
    ppVVar1[base_itr.
            super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>._M_cur.
            _4_4_] = local_50;
  }
  return;
}

Assistant:

void resolve_pipeline_library_info(const VkPipelineLibraryCreateInfoKHR &library,
	                                   const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		auto *libs = const_cast<VkPipeline *>(library.pLibraries);
		for (uint32_t i = 0; i < library.libraryCount; i++)
		{
			auto base_itr = pipelines.find((Hash) libs[i]);
			libs[i] = base_itr != end(pipelines) ? base_itr->second : VK_NULL_HANDLE;
		}
	}